

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O3

void __thiscall
google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_google::protobuf::Int32Value>_>
::MapSorterFlat(MapSorterFlat<google::protobuf::Map<int,_google::protobuf::Int32Value>_> *this,
               Map<int,_google::protobuf::Int32Value> *m)

{
  uint uVar1;
  uint uVar2;
  NodeBase **ppNVar3;
  long lVar4;
  pair<int,_const_void_*> *ppVar5;
  pair<int,_const_void_*> *ppVar6;
  uint uVar7;
  ulong uVar8;
  NodeBase *pNVar9;
  ulong uVar10;
  pair<int,_const_void_*> *ppVar11;
  
  uVar1 = (m->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_elements_;
  uVar10 = (ulong)uVar1;
  this->size_ = uVar10;
  if (uVar10 == 0) {
    (this->items_)._M_t.
    super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl =
         (pair<int,_const_void_*> *)0x0;
  }
  else {
    ppVar5 = (pair<int,_const_void_*> *)operator_new__(uVar10 * 0x10);
    ppVar11 = ppVar5 + uVar10;
    ppVar6 = ppVar5;
    do {
      ppVar6->first = 0;
      ppVar6->second = (void *)0x0;
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar11);
    (this->items_)._M_t.
    super___uniq_ptr_impl<std::pair<int,_const_void_*>,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<int,_const_void_*>_*,_std::default_delete<std::pair<int,_const_void_*>[]>_>
    .super__Head_base<0UL,_std::pair<int,_const_void_*>_*,_false>._M_head_impl = ppVar5;
    uVar2 = (m->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_;
    uVar7 = (m->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
    uVar8 = (ulong)uVar7;
    if (uVar7 != uVar2) {
      pNVar9 = (m->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar8];
      if (pNVar9 == (NodeBase *)0x0) {
        protobuf_assumption_failed
                  ("node != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                   ,0x22e);
      }
      ppNVar3 = (m->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_;
      ppVar6 = ppVar5;
      do {
        ppVar6->first = *(int *)&pNVar9[1].next;
        ppVar6->second = pNVar9 + 1;
        ppVar6 = ppVar6 + 1;
        pNVar9 = pNVar9->next;
        while (pNVar9 == (NodeBase *)0x0) {
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          if (uVar2 <= uVar7) goto LAB_00d10ab2;
          pNVar9 = ppNVar3[uVar7];
        }
      } while( true );
    }
LAB_00d10ab2:
    lVar4 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar1 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<std::pair<int,void_const*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterLessThan<int>>>
              (ppVar5,ppVar11,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<std::pair<int,void_const*>*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterLessThan<int>>>
              (ppVar5,ppVar11);
  }
  return;
}

Assistant:

explicit MapSorterFlat(const MapT& m)
      : size_(m.size()), items_(size_ ? new storage_type[size_] : nullptr) {
    if (!size_) return;
    storage_type* it = &items_[0];
    for (const auto& entry : m) {
      *it++ = {entry.first, &entry};
    }
    std::sort(&items_[0], &items_[size_],
              MapSorterLessThan<typename MapT::key_type>{});
  }